

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_helpers.cc
# Opt level: O2

bool google::protobuf::compiler::cxx::anon_unknown_0::HasExtension(Descriptor *descriptor)

{
  uint uVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  if (*(int *)(descriptor + 0x68) < 1) {
    uVar1 = *(uint *)(descriptor + 0x38);
    lVar4 = 0;
    uVar5 = 0;
    if (0 < (int)uVar1) {
      uVar5 = (ulong)uVar1;
    }
    uVar3 = 0;
    do {
      if (uVar5 == uVar3) {
        return (long)uVar3 < (long)(int)uVar1;
      }
      bVar2 = HasExtension((Descriptor *)(*(long *)(descriptor + 0x40) + lVar4));
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x78;
    } while (!bVar2);
  }
  return true;
}

Assistant:

bool HasExtension(const Descriptor* descriptor) {
  if (descriptor->extension_count() > 0) {
    return true;
  }
  for (int i = 0; i < descriptor->nested_type_count(); ++i) {
    if (HasExtension(descriptor->nested_type(i))) {
      return true;
    }
  }
  return false;
}